

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O0

vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *
calcu_in(int n,map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
               *use,
        map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
        *out,map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
             *def)

{
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *in_RDX;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *in_RDI;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> v1;
  iterator it;
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  *in_stack_fffffffffffffec8;
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  *this;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *this_00;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *in_stack_ffffffffffffff18;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *in_stack_ffffffffffffff20;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *in_stack_ffffffffffffff60;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *in_stack_ffffffffffffff68;
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_80;
  _Base_ptr local_38;
  _Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
  local_30 [6];
  
  this_00 = in_RDI;
  std::
  _Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
  ::_Rb_tree_iterator(local_30);
  local_38 = (_Base_ptr)
             std::
             map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
             ::find(in_stack_fffffffffffffec8,(key_type *)0x279d73);
  local_30[0]._M_node = local_38;
  std::
  _Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
  ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
                *)0x279d95);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  local_80._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)std::
               map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
               ::find(in_stack_fffffffffffffec8,(key_type *)0x279db8);
  local_30[0]._M_node = (_Base_ptr)local_80._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::
  _Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
  ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
                *)0x279e00);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  vectors_difference(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  this = &local_80;
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::operator=(this_00,in_RDX);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector(this_00);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector(this_00);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector(this_00);
  local_30[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
       ::find(this,(key_type *)0x279e83);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::
  _Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
  ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
                *)0x279ec8);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  vectors_set_union(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector(this_00);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector(this_00);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector(this_00);
  return in_RDI;
}

Assistant:

vector<mir::inst::VarId> calcu_in(int n, map<int, vector<mir::inst::VarId>> use,
                                  map<int, vector<mir::inst::VarId>> out,
                                  map<int, vector<mir::inst::VarId>> def) {
  // in[b] = use[b] U (out[b] - def[b])
  map<int, vector<mir::inst::VarId>>::iterator it;
  it = out.find(n);
  vector<mir::inst::VarId> v1 = it->second;
  it = def.find(n);
  v1 = vectors_difference(v1, it->second);
  it = use.find(n);
  return vectors_set_union(v1, it->second);
}